

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.h
# Opt level: O1

void __thiscall
MeCab::Allocator<mecab_node_t,_mecab_path_t>::Allocator(Allocator<mecab_node_t,_mecab_path_t> *this)

{
  FreeList<mecab_node_t> *pFVar1;
  result_pair_type *prVar2;
  
  this->_vptr_Allocator = (_func_int **)&PTR__Allocator_00140928;
  this->id_ = 0;
  pFVar1 = (FreeList<mecab_node_t> *)operator_new(0x38);
  pFVar1->_vptr_FreeList = (_func_int **)&PTR__FreeList_00140958;
  (pFVar1->freeList).super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pFVar1->freeList).super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pFVar1->freeList).super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pFVar1->pi_ = 0;
  pFVar1->li_ = 0;
  pFVar1->size = 0x200;
  (this->node_freelist_)._vptr_scoped_ptr = (_func_int **)&PTR__scoped_ptr_00140988;
  (this->node_freelist_).ptr_ = pFVar1;
  (this->path_freelist_)._vptr_scoped_ptr = (_func_int **)&PTR__scoped_ptr_001409b8;
  (this->path_freelist_).ptr_ = (FreeList<mecab_path_t> *)0x0;
  (this->char_freelist_)._vptr_scoped_ptr = (_func_int **)&PTR__scoped_ptr_001409e8;
  (this->char_freelist_).ptr_ = (ChunkFreeList<char> *)0x0;
  (this->nbest_generator_)._vptr_scoped_ptr = (_func_int **)&PTR__scoped_ptr_00140a18;
  (this->partial_buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->partial_buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->nbest_generator_).ptr_ = (NBestGenerator *)0x0;
  (this->partial_buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  prVar2 = (result_pair_type *)operator_new__(0x2000);
  (this->results_)._vptr_scoped_array = (_func_int **)&PTR__scoped_array_00140a48;
  (this->results_).ptr_ = prVar2;
  return;
}

Assistant:

Allocator()
      : id_(0),
        node_freelist_(new FreeList<N>(NODE_FREELIST_SIZE)),
        path_freelist_(0),
        char_freelist_(0),
        nbest_generator_(0),
        results_(new Dictionary::result_type[kResultsSize]) {}